

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O1

bool __thiscall
duckdb::PerfectHashJoinExecutor::TemplatedFillSelectionVectorBuild<int>
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *sel_vec,
          SelectionVector *seq_sel_vec,idx_t count)

{
  bool bVar1;
  int iVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  _Head_base<0UL,_bool_*,_false> _Var5;
  sel_t *psVar6;
  int32_t iVar7;
  int32_t iVar8;
  idx_t iVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  sel_t sVar14;
  bool bVar15;
  UnifiedVectorFormat vector_data;
  UnifiedVectorFormat local_78;
  
  if (((this->perfect_join_statistics).build_min.is_null == false) &&
     ((this->perfect_join_statistics).build_max.is_null == false)) {
    iVar7 = Value::GetValueUnsafe<int>(&(this->perfect_join_statistics).build_min);
    iVar8 = Value::GetValueUnsafe<int>(&(this->perfect_join_statistics).build_max);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(source,count,&local_78);
    bVar15 = count == 0;
    if (!bVar15) {
      psVar3 = (local_78.sel)->sel_vector;
      psVar4 = sel_vec->sel_vector;
      _Var5._M_head_impl =
           (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
           super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
           super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
           super__Head_base<0UL,_bool_*,_false>._M_head_impl;
      iVar9 = this->unique_keys;
      psVar6 = seq_sel_vec->sel_vector;
      lVar10 = 0;
      uVar11 = 0;
      do {
        uVar13 = uVar11;
        if (psVar3 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar3[uVar11];
        }
        iVar2 = *(int *)(local_78.data + uVar13 * 4);
        bVar12 = 1;
        sVar14 = iVar2 - iVar7;
        if ((iVar7 <= iVar2) && (iVar2 <= iVar8)) {
          psVar4[lVar10] = sVar14;
          bVar1 = _Var5._M_head_impl[(int)sVar14];
          if (bVar1 == false) {
            _Var5._M_head_impl[(int)sVar14] = true;
            iVar9 = iVar9 + 1;
            this->unique_keys = iVar9;
            psVar6[lVar10] = (sel_t)uVar11;
            lVar10 = lVar10 + 1;
          }
          bVar12 = bVar1 ^ 1;
        }
        if (bVar12 == 0) break;
        uVar11 = uVar11 + 1;
        bVar15 = count <= uVar11;
      } while (uVar11 != count);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  else {
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

bool PerfectHashJoinExecutor::TemplatedFillSelectionVectorBuild(Vector &source, SelectionVector &sel_vec,
                                                                SelectionVector &seq_sel_vec, idx_t count) {
	if (perfect_join_statistics.build_min.IsNull() || perfect_join_statistics.build_max.IsNull()) {
		return false;
	}
	auto min_value = perfect_join_statistics.build_min.GetValueUnsafe<T>();
	auto max_value = perfect_join_statistics.build_max.GetValueUnsafe<T>();
	UnifiedVectorFormat vector_data;
	source.ToUnifiedFormat(count, vector_data);
	auto data = reinterpret_cast<T *>(vector_data.data);
	// generate the selection vector
	for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
		auto data_idx = vector_data.sel->get_index(i);
		auto input_value = data[data_idx];
		// add index to selection vector if value in the range
		if (min_value <= input_value && input_value <= max_value) {
			auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
			sel_vec.set_index(sel_idx, idx);
			if (bitmap_build_idx[idx]) {
				return false;
			} else {
				bitmap_build_idx[idx] = true;
				unique_keys++;
			}
			seq_sel_vec.set_index(sel_idx++, i);
		}
	}
	return true;
}